

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void prepare_for_learner(vw *all,v_array<example_*> *examples)

{
  size_t sVar1;
  v_array<example_*> *in_RSI;
  substring example;
  char empty;
  example *ae;
  example *in_stack_00000168;
  vw *in_stack_00000170;
  undefined1 in_stack_00000178 [16];
  vw *in_stack_ffffffffffffffc0;
  v_array<example_*> *this;
  undefined1 local_19;
  example *local_18;
  
  sVar1 = v_array<example_*>::size(in_RSI);
  if (1 < sVar1) {
    local_18 = VW::get_unused_example(in_stack_ffffffffffffffc0);
    local_19 = 0;
    this = (v_array<example_*> *)&stack0xffffffffffffffe7;
    substring_to_example(in_stack_00000170,in_stack_00000168,(substring)in_stack_00000178);
    v_array<example_*>::push_back(this,(example **)local_18);
  }
  return;
}

Assistant:

inline void prepare_for_learner(vw* all, v_array<example*>& examples)
{
  // note: the json parser does single pass parsing and cannot determine if a shared example is needed.
  // since the communication between the parsing thread the main learner expects examples to be requested in order (as
  // they're layed out in memory) there is no way to determine upfront if a shared example exists thus even if there are
  // no features for the shared example, still an empty example is returned.

  // insert new line example at the end
  if (examples.size() > 1)
  {
    example& ae = VW::get_unused_example(all);
    char empty = '\0';
    substring example = {&empty, &empty};
    substring_to_example(all, &ae, example);

    examples.push_back(&ae);
  }
}